

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int lyp_precompile_pattern(ly_ctx *ctx,char *pattern,pcre **pcre_cmp,pcre_extra **pcre_std)

{
  int iVar1;
  pcre_extra *ppVar2;
  int iVar3;
  long local_38;
  char *err_msg;
  
  local_38 = 0;
  iVar1 = lyp_check_pattern(ctx,pattern,pcre_cmp);
  iVar3 = 1;
  if (iVar1 == 0) {
    iVar3 = 0;
    if (pcre_cmp != (pcre **)0x0 && pcre_std != (pcre_extra **)0x0) {
      iVar3 = 0;
      ppVar2 = (pcre_extra *)pcre_study(*pcre_cmp,0,&local_38);
      *pcre_std = ppVar2;
      if (local_38 != 0) {
        iVar3 = 0;
        ly_log(ctx,LY_LLWRN,LY_SUCCESS,"Studying pattern \"%s\" failed (%s).",pattern);
      }
    }
  }
  return iVar3;
}

Assistant:

int
lyp_precompile_pattern(struct ly_ctx *ctx, const char *pattern, pcre** pcre_cmp, pcre_extra **pcre_std)
{
    const char *err_msg = NULL;

    if (lyp_check_pattern(ctx, pattern, pcre_cmp)) {
        return EXIT_FAILURE;
    }

    if (pcre_std && pcre_cmp) {
        (*pcre_std) = pcre_study(*pcre_cmp, 0, &err_msg);
        if (err_msg) {
            LOGWRN(ctx, "Studying pattern \"%s\" failed (%s).", pattern, err_msg);
        }
    }

    return EXIT_SUCCESS;
}